

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlParserWarning(void *ctx,char *msg,...)

{
  xmlParserInputPtr pxVar1;
  xmlGenericErrorFunc p_Var2;
  char *pcVar3;
  char in_AL;
  int iVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  char *larger;
  int local_40;
  int chars;
  int prev_size;
  int size;
  char *str;
  xmlParserInputPtr cur;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  char *msg_local;
  void *ctx_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  cur = (xmlParserInputPtr)0x0;
  str = (char *)0x0;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (ctx != (void *)0x0) {
    pxVar1 = *(xmlParserInputPtr *)((long)ctx + 0x38);
    cur = pxVar1;
    if (((pxVar1 != (xmlParserInputPtr)0x0) && (pxVar1->filename == (char *)0x0)) &&
       (1 < *(int *)((long)ctx + 0x40))) {
      cur = *(xmlParserInputPtr *)
             (*(long *)((long)ctx + 0x48) + (long)(*(int *)((long)ctx + 0x40) + -2) * 8);
      str = (char *)pxVar1;
    }
    xmlParserPrintFileInfo(cur);
  }
  pp_Var5 = __xmlGenericError();
  p_Var2 = *pp_Var5;
  ppvVar6 = __xmlGenericErrorContext();
  (*p_Var2)(*ppvVar6,"warning: ");
  local_40 = -1;
  _prev_size = (char *)(*xmlMalloc)(0x96);
  if (_prev_size != (char *)0x0) {
    chars = 0x96;
    pcVar3 = _prev_size;
    do {
      _prev_size = pcVar3;
      if (63999 < chars) break;
      ap[0].overflow_arg_area = local_118;
      ap[0]._0_8_ = &stack0x00000008;
      local_64 = 0x30;
      local_68 = 0x10;
      iVar4 = vsnprintf(_prev_size,(long)chars,msg,&local_68);
      if (((-1 < iVar4) && (iVar4 < chars)) && (bVar7 = local_40 == iVar4, local_40 = iVar4, bVar7))
      break;
      if (iVar4 < 0) {
        chars = chars + 100;
      }
      else {
        chars = iVar4 + 1 + chars;
      }
      ap[0].reg_save_area = (*xmlRealloc)(_prev_size,(long)chars);
      pcVar3 = (char *)ap[0].reg_save_area;
    } while ((char *)ap[0].reg_save_area != (char *)0x0);
  }
  pp_Var5 = __xmlGenericError();
  p_Var2 = *pp_Var5;
  ppvVar6 = __xmlGenericErrorContext();
  (*p_Var2)(*ppvVar6,"%s",_prev_size);
  if (_prev_size != (char *)0x0) {
    (*xmlFree)(_prev_size);
  }
  if ((ctx != (void *)0x0) && (xmlParserPrintFileContext(cur), str != (char *)0x0)) {
    xmlParserPrintFileInfo((xmlParserInputPtr)str);
    pp_Var5 = __xmlGenericError();
    p_Var2 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar6,"\n");
    xmlParserPrintFileContext((xmlParserInputPtr)str);
  }
  return;
}

Assistant:

void XMLCDECL
xmlParserWarning(void *ctx, const char *msg, ...)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    char * str;

    if (ctxt != NULL) {
	input = ctxt->input;
	if ((input != NULL) && (input->filename == NULL) &&
	    (ctxt->inputNr > 1)) {
	    cur = input;
	    input = ctxt->inputTab[ctxt->inputNr - 2];
	}
	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "warning: ");
    XML_GET_VAR_STR(msg, str);
    xmlGenericError(xmlGenericErrorContext, "%s", str);
    if (str != NULL)
	xmlFree(str);

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
	if (cur != NULL) {
	    xmlParserPrintFileInfo(cur);
	    xmlGenericError(xmlGenericErrorContext, "\n");
	    xmlParserPrintFileContext(cur);
	}
    }
}